

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

void __thiscall
flatbuffers::FlatCompiler::ParseFile
          (FlatCompiler *this,Parser *parser,string *filename,string *contents,
          vector<const_char_*,_std::allocator<const_char_*>_> *include_directories)

{
  bool bVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> inc_directories;
  string local_include_directory;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_68;
  char *local_50;
  string local_48;
  
  StripFileName(&local_48,filename);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (char **)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::
  insert<__gnu_cxx::__normal_iterator<char_const*const*,std::vector<char_const*,std::allocator<char_const*>>>,void>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_68,(const_iterator)0x0,
             (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              )(include_directories->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              )(include_directories->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  local_50 = local_48._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_68,&local_50);
  local_50 = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_68,&local_50);
  bVar1 = Parser::Parse(parser,(contents->_M_dataplus)._M_p,
                        local_68._M_impl.super__Vector_impl_data._M_start,
                        (filename->_M_dataplus)._M_p);
  if (!bVar1) {
    (*(this->params_).error_fn)(this,&parser->error_,false,false);
  }
  if ((parser->error_)._M_string_length != 0) {
    (*(this->params_).warn_fn)(this,&parser->error_,false);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void FlatCompiler::ParseFile(
    flatbuffers::Parser &parser, const std::string &filename,
    const std::string &contents,
    const std::vector<const char *> &include_directories) const {
  auto local_include_directory = flatbuffers::StripFileName(filename);

  std::vector<const char *> inc_directories;
  inc_directories.insert(inc_directories.end(), include_directories.begin(),
                         include_directories.end());
  inc_directories.push_back(local_include_directory.c_str());
  inc_directories.push_back(nullptr);

  if (!parser.Parse(contents.c_str(), &inc_directories[0], filename.c_str())) {
    Error(parser.error_, false, false);
  }
  if (!parser.error_.empty()) { Warn(parser.error_, false); }
}